

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_update_tet_guess(REF_CELL ref_cell,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT *guess)

{
  int local_50;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  REF_INT *guess_local;
  REF_INT node2_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_CELL ref_cell_local;
  
  cell1 = node0;
  cell0 = node1;
  face_nodes[0] = node2;
  face_nodes[1] = node0;
  ref_cell_local._4_4_ = ref_cell_with_face(ref_cell,&cell1,&ref_private_macro_code_rss,&local_50);
  if (ref_cell_local._4_4_ == 0) {
    if (ref_private_macro_code_rss == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x338,
             "ref_update_tet_guess","bary update missing first");
      ref_cell_local._4_4_ = 1;
    }
    else if (local_50 == -1) {
      *guess = -1;
      ref_cell_local._4_4_ = 0;
    }
    else if (*guess == ref_private_macro_code_rss) {
      *guess = local_50;
      ref_cell_local._4_4_ = 0;
    }
    else if (*guess == local_50) {
      *guess = ref_private_macro_code_rss;
      ref_cell_local._4_4_ = 0;
    }
    else {
      ref_cell_local._4_4_ = 5;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x337,
           "ref_update_tet_guess",(ulong)ref_cell_local._4_4_,"next");
  }
  return ref_cell_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_update_tet_guess(REF_CELL ref_cell, REF_INT node0,
                                               REF_INT node1, REF_INT node2,
                                               REF_INT *guess) {
  REF_INT face_nodes[4], cell0, cell1;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "next");
  if (REF_EMPTY == cell0) THROW("bary update missing first");
  if (REF_EMPTY == cell1) { /* hit boundary */
    *guess = REF_EMPTY;
    return REF_SUCCESS;
  }

  if (*guess == cell0) {
    *guess = cell1;
    return REF_SUCCESS;
  }
  if (*guess == cell1) {
    *guess = cell0;
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}